

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

mipmapped_texture * __thiscall
crnlib::mipmapped_texture::operator=(mipmapped_texture *this,mipmapped_texture *rhs)

{
  face_vec *this_00;
  uint new_size;
  vector<crnlib::mip_level_*> *pvVar1;
  uint uVar2;
  component_flags cVar3;
  pixel_format pVar4;
  mip_level *pmVar5;
  uint j;
  ulong uVar6;
  mip_level *init0;
  uint i;
  ulong uVar7;
  
  if (this != rhs) {
    clear(this);
    dynamic_string::operator=(&this->m_name,&rhs->m_name);
    uVar2 = rhs->m_height;
    cVar3 = rhs->m_comp_flags;
    pVar4 = rhs->m_format;
    this->m_width = rhs->m_width;
    this->m_height = uVar2;
    this->m_comp_flags = cVar3;
    this->m_format = pVar4;
    this_00 = &this->m_faces;
    vector<crnlib::vector<crnlib::mip_level_*>_>::resize(this_00,(rhs->m_faces).m_size,false);
    for (uVar7 = 0; uVar7 < (this->m_faces).m_size; uVar7 = uVar7 + 1) {
      new_size = (rhs->m_faces).m_p[uVar7].m_size;
      init0 = (mip_level *)(ulong)new_size;
      vector<crnlib::mip_level_*>::resize(this_00->m_p + uVar7,new_size,false);
      for (uVar6 = 0; pvVar1 = (rhs->m_faces).m_p, uVar6 < pvVar1[uVar7].m_size; uVar6 = uVar6 + 1)
      {
        pmVar5 = crnlib_new<crnlib::mip_level,crnlib::mip_level>
                           ((crnlib *)pvVar1[uVar7].m_p[uVar6],init0);
        this_00->m_p[uVar7].m_p[uVar6] = pmVar5;
      }
    }
  }
  return this;
}

Assistant:

mipmapped_texture& mipmapped_texture::operator=(const mipmapped_texture& rhs) {
  if (this == &rhs)
    return *this;

  clear();

  m_name = rhs.m_name;
  m_width = rhs.m_width;
  m_height = rhs.m_height;

  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;

  m_faces.resize(rhs.m_faces.size());
  for (uint i = 0; i < m_faces.size(); i++) {
    m_faces[i].resize(rhs.m_faces[i].size());

    for (uint j = 0; j < rhs.m_faces[i].size(); j++)
      m_faces[i][j] = crnlib_new<mip_level>(*rhs.m_faces[i][j]);
  }

  CRNLIB_ASSERT((!is_valid()) || check());

  return *this;
}